

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

int xmlOutputBufferWrite(xmlOutputBufferPtr out,int len,char *buf)

{
  xmlBufPtr *ppxVar1;
  xmlBufPtr *ppxVar2;
  xmlOutputWriteCallback p_Var3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  xmlBufPtr pxVar7;
  size_t sVar8;
  xmlBufPtr *ppxVar9;
  xmlChar *pxVar10;
  int iVar11;
  int len_00;
  ulong uVar12;
  
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
LAB_0019879a:
    iVar11 = -1;
  }
  else if (len < 0) {
    iVar11 = 0;
  }
  else {
    ppxVar1 = &out->conv;
    ppxVar2 = &out->buffer;
    iVar11 = 0;
    do {
      uVar12 = 16000;
      if ((uint)len < 16000) {
        uVar12 = (ulong)(uint)len;
      }
      len_00 = (int)uVar12;
      if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
        iVar5 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,len_00);
        if (iVar5 != 0) goto LAB_0019879a;
        ppxVar9 = ppxVar2;
        iVar5 = len_00;
        if (out->writecallback == (xmlOutputWriteCallback)0x0) goto LAB_00198902;
LAB_0019889c:
        sVar8 = xmlBufUse(*ppxVar9);
        iVar5 = (int)sVar8;
        p_Var3 = out->writecallback;
        len = len - len_00;
        if (p_Var3 != (xmlOutputWriteCallback)0x0) {
          if ((iVar5 < 4000) && (len < 1)) {
            return iVar11;
          }
          pvVar4 = out->context;
          if (out->encoder == (xmlCharEncodingHandlerPtr)0x0) {
            pxVar10 = xmlBufContent(*ppxVar2);
            uVar6 = (*p_Var3)(pvVar4,(char *)pxVar10,iVar5);
            ppxVar9 = ppxVar2;
          }
          else {
            pxVar10 = xmlBufContent(*ppxVar1);
            uVar6 = (*p_Var3)(pvVar4,(char *)pxVar10,iVar5);
            ppxVar9 = ppxVar1;
          }
          if ((int)uVar6 < 0) {
            iVar11 = 0x60a;
            __xmlSimpleError(8,0x60a,(xmlNodePtr)0x0,"write error",(char *)0x0);
LAB_001989c7:
            out->error = iVar11;
            return uVar6;
          }
          xmlBufShrink(*ppxVar9,(ulong)uVar6);
          if ((int)(uVar6 ^ 0x7fffffff) < out->written) {
            out->written = 0x7fffffff;
          }
          else {
            out->written = out->written + uVar6;
          }
        }
      }
      else {
        if (*ppxVar1 == (xmlBufPtr)0x0) {
          pxVar7 = xmlBufCreate();
          *ppxVar1 = pxVar7;
        }
        iVar5 = xmlBufAdd(*ppxVar2,(xmlChar *)buf,len_00);
        if (iVar5 != 0) goto LAB_0019879a;
        sVar8 = xmlBufUse(*ppxVar2);
        if (sVar8 < 4000 && (uint)len < 0x3e81) {
          return iVar11;
        }
        iVar5 = xmlCharEncOutput(out,0);
        if (iVar5 != -3 && iVar5 < 0) {
          iVar11 = 0x608;
          __xmlSimpleError(8,0x608,(xmlNodePtr)0x0,"encoder error",(char *)0x0);
          uVar6 = 0xffffffff;
          goto LAB_001989c7;
        }
        ppxVar9 = ppxVar1;
        if (out->writecallback != (xmlOutputWriteCallback)0x0) goto LAB_0019889c;
        if (iVar5 < 1) {
          iVar5 = 0;
        }
LAB_00198902:
        len = len - len_00;
      }
      buf = (char *)((xmlChar *)buf + uVar12);
      iVar11 = iVar11 + iVar5;
    } while (0 < len);
  }
  return iVar11;
}

Assistant:

int
xmlOutputBufferWrite(xmlOutputBufferPtr out, int len, const char *buf) {
    int nbchars = 0; /* number of chars to output to I/O */
    int ret;         /* return from function call */
    int written = 0; /* number of char written to I/O so far */
    int chunk;       /* number of byte current processed from buf */

    if ((out == NULL) || (out->error)) return(-1);
    if (len < 0) return(0);
    if (out->error) return(-1);

    do {
	chunk = len;
	if (chunk > 4 * MINLEN)
	    chunk = 4 * MINLEN;

	/*
	 * first handle encoding stuff.
	 */
	if (out->encoder != NULL) {
	    /*
	     * Store the data in the incoming raw buffer
	     */
	    if (out->conv == NULL) {
		out->conv = xmlBufCreate();
	    }
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);

	    if ((xmlBufUse(out->buffer) < MINLEN) && (chunk == len))
		goto done;

	    /*
	     * convert as much as possible to the parser reading buffer.
	     */
	    ret = xmlCharEncOutput(out, 0);
	    if ((ret < 0) && (ret != -3)) {
		xmlIOErr(XML_IO_ENCODER, NULL);
		out->error = XML_IO_ENCODER;
		return(-1);
	    }
            if (out->writecallback)
	        nbchars = xmlBufUse(out->conv);
            else
                nbchars = ret >= 0 ? ret : 0;
	} else {
	    ret = xmlBufAdd(out->buffer, (const xmlChar *) buf, chunk);
	    if (ret != 0)
	        return(-1);
            if (out->writecallback)
	        nbchars = xmlBufUse(out->buffer);
            else
                nbchars = chunk;
	}
	buf += chunk;
	len -= chunk;

	if (out->writecallback) {
            if ((nbchars < MINLEN) && (len <= 0))
                goto done;

	    /*
	     * second write the stuff to the I/O channel
	     */
	    if (out->encoder != NULL) {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->conv), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->conv, ret);
	    } else {
		ret = out->writecallback(out->context,
                           (const char *)xmlBufContent(out->buffer), nbchars);
		if (ret >= 0)
		    xmlBufShrink(out->buffer, ret);
	    }
	    if (ret < 0) {
		xmlIOErr(XML_IO_WRITE, NULL);
		out->error = XML_IO_WRITE;
		return(ret);
	    }
            if (out->written > INT_MAX - ret)
                out->written = INT_MAX;
            else
                out->written += ret;
	}
	written += nbchars;
    } while (len > 0);

done:
#ifdef DEBUG_INPUT
    xmlGenericError(xmlGenericErrorContext,
	    "I/O: wrote %d chars\n", written);
#endif
    return(written);
}